

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::set<(anonymous_namespace)::ns::Value,std::less<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  bool bVar1;
  int iVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  iterator this_00;
  system_error *psVar4;
  _Link_type __x;
  const_array_range_type cVar5;
  error_code __ec;
  error_code __ec_00;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  _Base_ptr p_Stack_80;
  size_t local_78;
  _Base_ptr local_70;
  error_code local_68;
  _Base_ptr local_58 [3];
  _Rb_tree_color local_40;
  undefined4 uStack_3c;
  _Base_ptr local_38;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    psVar4 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(&local_68,conversion_failed);
    local_a0 = (undefined1  [8])(local_98 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Not a ns::Project","");
    __ec._4_4_ = 0;
    __ec._M_value = local_68._M_value;
    *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b58738;
    __ec._M_cat = local_68._M_cat;
    std::system_error::system_error(psVar4,__ec,(string *)local_a0);
    *(undefined8 *)psVar4 = 0xb5b5d8;
    *(undefined8 *)(psVar4 + 0x50) = 0xb5b610;
    *(undefined8 *)(psVar4 + 0x20) = 0;
    *(undefined8 *)(psVar4 + 0x28) = 0;
    *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
    *(undefined8 *)(psVar4 + 0x38) = 0;
    psVar4[0x40] = (system_error)0x0;
    __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->notes)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  local_70 = &(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_70;
  (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = (undefined1  [8])0x7;
  local_98._0_8_ = "version";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x7;
    local_98._0_8_ = "version";
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)local_a0);
    iVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>
                      (pbVar3);
    __return_storage_ptr__->version = iVar2;
  }
  local_a0 = (undefined1  [8])0x4;
  local_98._0_8_ = "name";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x4;
    local_98._0_8_ = "name";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->name);
  }
  local_a0 = (undefined1  [8])&DAT_00000006;
  local_98._0_8_ = "author";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])&DAT_00000006;
    local_98._0_8_ = "author";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->author);
  }
  local_a0 = (undefined1  [8])&DAT_00000005;
  local_98._0_8_ = "notes";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])&DAT_00000005;
    local_98._0_8_ = "notes";
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)local_a0,&__return_storage_ptr__->notes);
  }
  local_a0 = (undefined1  [8])0x9;
  local_98._0_8_ = "showNotes";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    local_a0 = (undefined1  [8])0x9;
    local_98._0_8_ = "showNotes";
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)local_a0);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar3);
    __return_storage_ptr__->showNotes = bVar1;
  }
  local_a0 = (undefined1  [8])&DAT_00000006;
  local_98._0_8_ = "values";
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)local_a0);
  if (bVar1) {
    __x = (_Link_type)&stack0xffffffffffffffc0;
    local_40 = 6;
    uStack_3c = 0;
    local_38 = (_Base_ptr)0x879d8b;
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)__x);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(pbVar3);
    if (!bVar1) {
      psVar4 = (system_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)local_a0,not_vector);
      __ec_00._0_8_ = (ulong)local_a0 & 0xffffffff;
      *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b58738;
      __ec_00._M_cat = (error_category *)local_98._0_8_;
      std::system_error::system_error(psVar4,__ec_00);
      *(undefined8 *)psVar4 = 0xb5b5d8;
      *(undefined8 *)(psVar4 + 0x50) = 0xb5b610;
      *(undefined8 *)(psVar4 + 0x20) = 0;
      *(undefined8 *)(psVar4 + 0x28) = 0;
      *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
      *(undefined8 *)(psVar4 + 0x38) = 0;
      psVar4[0x40] = (system_error)0x0;
      __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_98._16_8_ = local_98;
    local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
    local_98._8_8_ = (_Base_ptr)0x0;
    local_78 = 0;
    p_Stack_80 = (_Base_ptr)local_98._16_8_;
    cVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(pbVar3);
    this_00 = cVar5.first_._M_current;
    if (this_00._M_current != cVar5.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        as<(anonymous_namespace)::ns::Value>((type *)&local_68,this_00._M_current);
        __x = (_Link_type)&local_68;
        std::
        set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
        ::insert((set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  *)local_a0,(value_type *)&local_68);
        if ((_Base_ptr *)CONCAT44(local_68._4_4_,local_68._M_value) != local_58) {
          __x = (_Link_type)((long)&local_58[0]->_M_color + 1);
          operator_delete((_Base_ptr *)CONCAT44(local_68._4_4_,local_68._M_value),(ulong)__x);
        }
        this_00._M_current = this_00._M_current + 1;
      } while (this_00._M_current != cVar5.last_._M_current._M_current);
    }
    std::
    _Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::_M_erase((_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                *)(__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent,__x);
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_70
    ;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70;
    (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((_Base_ptr)local_98._8_8_ != (_Base_ptr)0x0) {
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_98._0_4_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_98._8_8_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_98._16_8_;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           p_Stack_80;
      *(_Base_ptr *)(local_98._8_8_ + 8) = local_70;
      (__return_storage_ptr__->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_78;
      local_98._8_8_ = (_Base_ptr)0x0;
      local_98._16_8_ = local_98;
      local_78 = 0;
      p_Stack_80 = (_Base_ptr)local_98._16_8_;
    }
    std::
    _Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::_M_erase((_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                *)local_98._8_8_,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }